

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsymtab.c
# Opt level: O0

D_Sym * find_D_Sym_internal(D_Scope *cur,char *name,int len,uint h)

{
  int iVar1;
  D_Scope *local_30;
  D_Sym *ll;
  uint h_local;
  int len_local;
  char *name_local;
  D_Scope *cur_local;
  
  if (cur == (D_Scope *)0x0) {
    cur_local = (D_Scope *)0x0;
  }
  else {
    if (cur->hash == (D_SymHash *)0x0) {
      local_30 = (D_Scope *)cur->ll;
    }
    else {
      local_30 = (D_Scope *)(cur->hash->syms).v[(ulong)h % (ulong)(cur->hash->syms).n];
    }
    while ((local_30 != (D_Scope *)0x0 &&
           (((*(uint *)((long)&local_30->ll + 4) != h || (*(int *)&local_30->ll != len)) ||
            (iVar1 = strncmp(*(char **)local_30,name,(long)len), iVar1 != 0))))) {
      local_30 = local_30->search;
    }
    if (local_30 == (D_Scope *)0x0) {
      if ((cur->dynamic == (D_Scope *)0x0) ||
         (local_30 = (D_Scope *)find_D_Sym_in_Scope_internal(cur->dynamic,name,len,h),
         cur_local = local_30, local_30 == (D_Scope *)0x0)) {
        if (cur->search == (D_Scope *)0x0) {
          cur_local = local_30;
        }
        else {
          cur_local = (D_Scope *)find_D_Sym_internal(cur->search,name,len,h);
        }
      }
    }
    else {
      cur_local = local_30;
    }
  }
  return (D_Sym *)cur_local;
}

Assistant:

static D_Sym *find_D_Sym_internal(D_Scope *cur, char *name, int len, uint h) {
  D_Sym *ll;
  if (!cur) return NULL;
  if (cur->hash)
    ll = cur->hash->syms.v[h % cur->hash->syms.n];
  else
    ll = cur->ll;
  while (ll) {
    if (ll->hash == h && ll->len == len && !strncmp(ll->name, name, len)) break;
    ll = ll->next;
  }
  if (!ll) {
    if (cur->dynamic)
      if ((ll = find_D_Sym_in_Scope_internal(cur->dynamic, name, len, h))) return ll;
    if (cur->search) return find_D_Sym_internal(cur->search, name, len, h);
    return ll;
  }
  return ll;
}